

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix2 * matrix2_inverse(matrix2 *self,matrix2 *mR)

{
  short sVar1;
  double f1;
  byte local_49;
  uint8_t i;
  double determinant;
  matrix2 inverse;
  matrix2 *mR_local;
  matrix2 *self_local;
  
  inverse.field_0.m[3] = (double)mR;
  f1 = matrix2_determinant(self);
  sVar1 = scalar_equalsf(f1,0.0);
  if (sVar1 == 0) {
    determinant = (self->field_0).m[3];
    inverse.field_0.m[1] = -(self->field_0).m[2];
    inverse.field_0.m[0] = -(self->field_0).m[1];
    inverse.field_0.m[2] = (self->field_0).m[0];
    for (local_49 = 0; local_49 < 4; local_49 = local_49 + 1) {
      *(double *)((long)inverse.field_0.m[3] + (ulong)local_49 * 8) =
           (&determinant)[local_49] * (1.0 / f1);
    }
    self_local = (matrix2 *)inverse.field_0.m[3];
  }
  else {
    self_local = (matrix2 *)0x0;
  }
  return self_local;
}

Assistant:

HYPAPI struct matrix2 *matrix2_inverse(const struct matrix2 *self, struct matrix2 *mR)
{
	struct matrix2 inverse;
	HYP_FLOAT determinant;
	uint8_t i;

	determinant = matrix2_determinant(self);

	/* calculated early for a quick exit if no determinant exists */
	if (scalar_equalsf(determinant, 0.0f)) {
		return NULL;
	}

	determinant = 1.0f / determinant;

	/* find the adjugate of self */
	inverse.c00 = self->c11;
	inverse.c01 = -self->c01;
	inverse.c10 = -self->c10;
	inverse.c11 = self->c00;

	/* divide the determinant */
	for (i = 0; i < 4; i++) {
		mR->m[i] = inverse.m[i] * determinant;
	}

	return mR;
}